

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O2

ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> * __thiscall
mp::pre::ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>::operator=
          (ValueMap<mp::pre::ValueNode,mp::pre::BasicValuePresolver&> *this,
          ValueMap<std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>,_int> *m)

{
  _Base_ptr p_Var1;
  BasicValuePresolver *vp;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_mp::pre::ValueNode>_>,_bool> pVar2;
  vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> local_140;
  pair<const_int,_mp::pre::ValueNode> local_128;
  ValueNode local_a8;
  
  for (p_Var1 = (m->map_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(m->map_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::vector
              (&local_140,
               (vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_> *)&p_Var1[1]._M_parent
              );
    CreateArray<mp::pre::ValueNode,mp::pre::BasicValuePresolver&>(&local_a8,*(pre **)this,vp);
    std::pair<const_int,_mp::pre::ValueNode>::pair<mp::pre::ValueNode,_true>
              (&local_128,(int *)(p_Var1 + 1),&local_a8);
    pVar2 = std::
            _Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
            ::_M_insert_unique<std::pair<int_const,mp::pre::ValueNode>>
                      ((_Rb_tree<int,std::pair<int_const,mp::pre::ValueNode>,std::_Select1st<std::pair<int_const,mp::pre::ValueNode>>,std::less<int>,std::allocator<std::pair<int_const,mp::pre::ValueNode>>>
                        *)(this + 0x28),&local_128);
    ValueNode::operator=((ValueNode *)&pVar2.first._M_node._M_node[1]._M_parent,&local_140);
    ValueNode::~ValueNode(&local_128.second);
    ValueNode::~ValueNode(&local_a8);
    std::vector<mp::pre::VCString,_std::allocator<mp::pre::VCString>_>::~vector(&local_140);
  }
  return (ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&> *)this;
}

Assistant:

ValueMap& operator=(const ValueMap<Array2>& m) {
    for (const auto& a2: m.GetMap())
      map_.insert({
                    a2.first, CreateArray<Array, Param>(prm_)
                  }).first->second =
          a2.second;
    return *this;
  }